

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_riff_midi.cpp
# Opt level: O0

uint32_t toInt32LE(const_iterator in)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  reference puVar4;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_10;
  const_iterator in_local;
  
  local_10._M_current = in._M_current;
  puVar4 = __gnu_cxx::
           __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&local_10,0);
  uVar1 = *puVar4;
  puVar4 = __gnu_cxx::
           __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&local_10,1);
  uVar2 = *puVar4;
  puVar4 = __gnu_cxx::
           __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&local_10,2);
  uVar3 = *puVar4;
  puVar4 = __gnu_cxx::
           __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&local_10,3);
  return CONCAT13(*puVar4,CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
}

Assistant:

static inline uint32_t toInt32LE( std::vector<uint8_t>::const_iterator in )
{
    return static_cast<uint32_t>( in[ 0 ] ) |
           static_cast<uint32_t>( in[ 1 ] << 8 ) |
           static_cast<uint32_t>( in[ 2 ] << 16 ) |
           static_cast<uint32_t>( in[ 3 ] << 24 );
}